

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_convolve_2d_scale_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  CONV_BUF_TYPE *pCVar4;
  byte bVar5;
  uint16_t uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  short *psVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int x_qn;
  int16_t *piVar22;
  ulong uVar23;
  long lVar24;
  int16_t im_block [34304];
  
  uVar1 = filter_params_y->taps;
  uVar14 = ((h + -1) * y_step_qn + subpel_y_qn >> 10) + (uint)uVar1;
  iVar19 = (uVar1 >> 1) - 1;
  bVar9 = (byte)conv_params->round_0;
  uVar23 = 0;
  uVar20 = 0;
  if (0 < w) {
    uVar20 = (ulong)(uint)w;
  }
  uVar16 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar16 = uVar23;
  }
  uVar2 = filter_params_x->taps;
  lVar17 = (long)src + (2 - ((ulong)(uVar2 & 0xfffffffe) + (long)(iVar19 * src_stride) * 2));
  pCVar4 = conv_params->dst;
  iVar3 = conv_params->dst_stride;
  bVar5 = (byte)conv_params->round_1;
  lVar24 = (long)w;
  for (; uVar23 != uVar16; uVar23 = uVar23 + 1) {
    uVar14 = subpel_x_qn;
    for (uVar18 = 0; uVar18 != uVar20; uVar18 = uVar18 + 1) {
      iVar21 = 1 << ((char)bd + 6U & 0x1f);
      for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
        iVar21 = iVar21 + (uint)*(ushort *)(lVar17 + (long)((int)uVar14 >> 10) * 2 + uVar8 * 2) *
                          (int)*(short *)((long)filter_params_x->filter_ptr +
                                         uVar8 * 2 + (ulong)((uVar14 >> 6 & 0xf) * (uint)uVar2 * 2))
        ;
      }
      im_block[uVar18 + uVar23 * lVar24] =
           (int16_t)(iVar21 + ((1 << (bVar9 & 0x1f)) >> 1) >> (bVar9 & 0x1f));
      uVar14 = uVar14 + x_step_qn;
    }
    lVar17 = lVar17 + (long)src_stride * 2;
  }
  bVar10 = 0xe - (bVar5 + bVar9);
  bVar11 = ((char)bd - bVar9) + 0xe;
  bVar12 = bVar11 - bVar5;
  bVar9 = bVar12 - 1 & 0x1f;
  iVar21 = ((1 << (bVar10 & 0x1f)) >> 1) + (-1 << (bVar12 & 0x1f)) + (-1 << bVar9);
  uVar16 = (ulong)(uint)(0 << bVar9);
  uVar23 = (ulong)(uint)h;
  if (h < 1) {
    uVar23 = uVar16;
  }
  piVar22 = im_block + (1 - (ulong)(uVar1 >> 1)) * lVar24 + (long)(iVar19 * w);
  for (; uVar16 != uVar20; uVar16 = uVar16 + 1) {
    uVar14 = subpel_y_qn;
    for (uVar18 = 0; uVar18 != uVar23; uVar18 = uVar18 + 1) {
      psVar15 = piVar22 + ((int)uVar14 >> 10) * w;
      iVar19 = 1 << (bVar11 & 0x1f);
      for (uVar8 = 0; filter_params_y->taps != uVar8; uVar8 = uVar8 + 1) {
        iVar19 = iVar19 + (int)*psVar15 *
                          (int)*(short *)((long)filter_params_y->filter_ptr +
                                         uVar8 * 2 +
                                         (ulong)((uVar14 >> 6 & 0xf) * (uint)filter_params_y->taps *
                                                2));
        psVar15 = psVar15 + lVar24;
      }
      uVar7 = iVar19 + ((1 << (bVar5 & 0x1f)) >> 1) >> (bVar5 & 0x1f);
      if (conv_params->is_compound == 0) {
        uVar6 = clip_pixel_highbd((int)((uVar7 & 0xffff) + iVar21) >> (bVar10 & 0x1f),bd);
        dst[uVar16 + uVar18 * (long)dst_stride] = uVar6;
      }
      else {
        lVar17 = uVar18 * (long)iVar3;
        if (conv_params->do_average == 0) {
          pCVar4[uVar16 + lVar17] = (CONV_BUF_TYPE)uVar7;
        }
        else {
          uVar13 = (uint)pCVar4[uVar16 + lVar17];
          if (conv_params->use_dist_wtd_comp_avg == 0) {
            uVar7 = (uVar7 & 0xffff) + uVar13 >> 1;
          }
          else {
            uVar7 = (int)((uVar7 & 0xffff) * conv_params->bck_offset +
                         uVar13 * conv_params->fwd_offset) >> 4;
          }
          uVar6 = clip_pixel_highbd((int)(uVar7 + iVar21) >> (bVar10 & 0x1f),bd);
          dst[uVar16 + uVar18 * (long)dst_stride] = uVar6;
        }
      }
      uVar14 = uVar14 + y_step_qn;
    }
    piVar22 = piVar22 + 1;
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_scale_c(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_x_qn, const int x_step_qn,
                                    const int subpel_y_qn, const int y_step_qn,
                                    ConvolveParams *conv_params, int bd) {
  int16_t im_block[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  const int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  for (int y = 0; y < im_h; ++y) {
    int x_qn = subpel_x_qn;
    for (int x = 0; x < w; ++x, x_qn += x_step_qn) {
      const uint16_t *const src_x = &src_horiz[(x_qn >> SCALE_SUBPEL_BITS)];
      const int x_filter_idx = (x_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(x_filter_idx < SUBPEL_SHIFTS);
      const int16_t *x_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_x, x_filter_idx);
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_x[k - fo_horiz];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
    src_horiz += src_stride;
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int x = 0; x < w; ++x) {
    int y_qn = subpel_y_qn;
    for (int y = 0; y < h; ++y, y_qn += y_step_qn) {
      const int16_t *src_y = &src_vert[(y_qn >> SCALE_SUBPEL_BITS) * im_stride];
      const int y_filter_idx = (y_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(y_filter_idx < SUBPEL_SHIFTS);
      const int16_t *y_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_y, y_filter_idx);
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_y[(k - fo_vert) * im_stride];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->is_compound) {
        if (conv_params->do_average) {
          int32_t tmp = dst16[y * dst16_stride + x];
          if (conv_params->use_dist_wtd_comp_avg) {
            tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
            tmp = tmp >> DIST_PRECISION_BITS;
          } else {
            tmp += res;
            tmp = tmp >> 1;
          }
          /* Subtract round offset and convolve round */
          tmp = tmp - ((1 << (offset_bits - conv_params->round_1)) +
                       (1 << (offset_bits - conv_params->round_1 - 1)));
          dst[y * dst_stride + x] =
              clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
        } else {
          dst16[y * dst16_stride + x] = res;
        }
      } else {
        /* Subtract round offset and convolve round */
        int32_t tmp = res - ((1 << (offset_bits - conv_params->round_1)) +
                             (1 << (offset_bits - conv_params->round_1 - 1)));
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
      }
    }
    src_vert++;
  }
}